

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceValidators.cpp
# Opt level: O2

Result * CoreML::validateOptional(Result *__return_storage_ptr__,Model *format)

{
  uint32_t uVar1;
  Rep *pRVar2;
  bool bVar3;
  void **ppvVar4;
  long lVar5;
  undefined1 *puVar6;
  undefined1 *puVar7;
  allocator<char> local_89;
  undefined1 local_88 [40];
  Result r;
  string local_38;
  
  Result::Result(&r);
  validateDefaultOptionalValues((Result *)local_88,format);
  Result::operator=(&r,(Result *)local_88);
  std::__cxx11::string::~string((string *)(local_88 + 8));
  bVar3 = Result::good(&r);
  if (bVar3) {
    uVar1 = format->_oneof_case_[0];
    if ((2 < uVar1 - 200) && (uVar1 != 0x12e)) {
      if (uVar1 == 0x12f) {
LAB_0026c0c3:
        puVar6 = (undefined1 *)format->description_;
        if ((ModelDescription *)puVar6 == (ModelDescription *)0x0) {
          puVar6 = Specification::_ModelDescription_default_instance_;
        }
        validateOptionalNN((Result *)local_88,(ModelDescription *)puVar6);
      }
      else {
        if (uVar1 == 0x192) goto LAB_0026c0f6;
        if ((uVar1 == 0x193) || (uVar1 == 500)) goto LAB_0026c0c3;
        if (uVar1 == 0x1f5) goto LAB_0026c0f6;
        if (uVar1 == 3000) goto LAB_0026c0c3;
        if ((uVar1 == 0x259) || (uVar1 == 900)) goto LAB_0026c0f6;
        if (uVar1 == 0x1f6) goto LAB_0026c0c3;
        puVar6 = (undefined1 *)format->description_;
        if ((ModelDescription *)puVar6 == (ModelDescription *)0x0) {
          puVar6 = Specification::_ModelDescription_default_instance_;
        }
        pRVar2 = (((ModelDescription *)puVar6)->input_).super_RepeatedPtrFieldBase.rep_;
        ppvVar4 = pRVar2->elements;
        if (pRVar2 == (Rep *)0x0) {
          ppvVar4 = (void **)0x0;
        }
        lVar5 = 0;
        do {
          if ((long)(((ModelDescription *)puVar6)->input_).super_RepeatedPtrFieldBase.current_size_
              * 8 == lVar5) {
            validateOptionalOutputs((Result *)local_88,(ModelDescription *)puVar6);
            goto LAB_0026c0dd;
          }
          puVar7 = *(undefined1 **)(*(long *)((long)ppvVar4 + lVar5) + 0x20);
          if (puVar7 == (undefined1 *)0x0) {
            puVar7 = Specification::_FeatureType_default_instance_;
          }
          lVar5 = lVar5 + 8;
        } while (puVar7[0x10] != '\x01');
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_38,"Features cannot be optional to this type of model.",
                   &local_89);
        Result::Result((Result *)local_88,INVALID_MODEL_PARAMETERS,&local_38);
        std::__cxx11::string::~string((string *)&local_38);
      }
LAB_0026c0dd:
      Result::operator=(&r,(Result *)local_88);
      std::__cxx11::string::~string((string *)(local_88 + 8));
    }
LAB_0026c0f6:
    bVar3 = Result::good(&r);
    if (bVar3) {
      puVar6 = (undefined1 *)format->description_;
      if ((ModelDescription *)puVar6 == (ModelDescription *)0x0) {
        puVar6 = Specification::_ModelDescription_default_instance_;
      }
      validateOptionalOutputs(__return_storage_ptr__,(ModelDescription *)puVar6);
      goto LAB_0026c12b;
    }
  }
  Result::Result(__return_storage_ptr__,&r);
LAB_0026c12b:
  std::__cxx11::string::~string((string *)&r.m_message);
  return __return_storage_ptr__;
}

Assistant:

Result validateOptional(const Specification::Model& format) {
        Result r;
        r = validateDefaultOptionalValues(format);

        if (!r.good()) {
            return r;
        }

        switch (format.Type_case()) {
            case Specification::Model::kImputer:
                // Imputed values can be handled by replacing a particular value, so
                // optional is not required.
                break;
            case Specification::Model::kNeuralNetwork:
            case Specification::Model::kNeuralNetworkRegressor:
            case Specification::Model::kNeuralNetworkClassifier:
            case Specification::Model::kSerializedModel:
            case Specification::Model::kMlProgram:
                r = validateOptionalNN(format.description());
                break;
            case Specification::Model::kTreeEnsembleRegressor:
            case Specification::Model::kTreeEnsembleClassifier:
                // allow arbitrary optional in tree inputs, just check outputs
                break;
            case Specification::Model::kPipeline:
            case Specification::Model::kPipelineRegressor:
            case Specification::Model::kPipelineClassifier:
                // pipeline has valid optional inputs iff the models inside are valid.
                // this should be guaranteed by the pipeline validator.
                break;
            case Specification::Model::kItemSimilarityRecommender:
                // allow arbitrary optional in the recommender.  The recommender valiadator catches these.
                break;
            case Specification::Model::kIdentity:
                // anything goes for the identity function
                break;
            default:
                r = validateOptionalGeneric(format.description());
        }
        if (!r.good()) {
            return r;
        }

        return validateOptionalOutputs(format.description());
    }